

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request)

{
  ptls_emit_certificate_t *ppVar1;
  ptls_buffer_t *buf;
  ptls_buffer_t *ppVar2;
  st_ptls_sign_certificate_t *psVar3;
  char cVar4;
  int iVar5;
  ptls_private_key_result_t pVar6;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  ptls_emit_certificate_t *ppVar10;
  size_t sVar11;
  size_t sVar12;
  ptls_buffer_t *ppVar13;
  ptls_hash_context_t **pppVar14;
  ptls_key_schedule_t *ppVar15;
  size_t sVar16;
  bool bVar17;
  ptls_iovec_t pVar18;
  ptls_iovec_t pVar19;
  uint16_t algo_1;
  uint16_t algo;
  ptls_buffer_t *local_230;
  size_t local_228;
  ptls_key_schedule_t *local_220;
  ptls_key_schedule_t *local_218;
  size_t local_210;
  uint8_t data [226];
  uint8_t handshake_data [226];
  
  ppVar1 = tls->ctx->emit_certificate;
  ppVar10 = &send_certificate_and_certificate_verify::default_emit_certificate;
  if (ppVar1 != (ptls_emit_certificate_t *)0x0) {
    ppVar10 = ppVar1;
  }
  if ((tls->field_0x160 & 0x20) == 0) {
    if (signature_algorithms->count == 0) {
      return 0x6d;
    }
    iVar5 = (*ppVar10->cb)(ppVar10,tls,emitter,tls->key_schedule,context,push_status_request);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
      return 0;
    }
    if ((tls->ctx->private_key_method == (ptls_private_key_method_t *)0x0) ||
       ((tls->field_0x160 & 1) == 0)) {
      iVar5 = (*emitter->begin_message)(emitter);
      if (iVar5 != 0) {
        return iVar5;
      }
      local_230 = emitter->buf;
      ppVar15 = tls->key_schedule;
      local_228 = local_230->off;
      iVar5 = ptls_buffer_reserve(local_230,1);
      if (iVar5 == 0) {
        local_230->base[local_230->off] = '\x0f';
        local_230->off = local_230->off + 1;
        iVar5 = 0;
      }
      if (iVar5 == 0) {
        iVar5 = ptls_buffer_reserve(local_230,3);
        if (iVar5 == 0) {
          puVar9 = local_230->base;
          sVar12 = local_230->off;
          puVar9[sVar12 + 2] = '\0';
          puVar9 = puVar9 + sVar12;
          puVar9[0] = '\0';
          puVar9[1] = '\0';
          local_230->off = local_230->off + 3;
          iVar5 = 0;
        }
        if (iVar5 == 0) {
          sVar12 = local_230->off;
          ppVar2 = emitter->buf;
          local_220 = (ptls_key_schedule_t *)ppVar2->off;
          local_218 = ppVar15;
          iVar5 = ptls_buffer_reserve(ppVar2,2);
          if (iVar5 == 0) {
            puVar9 = ppVar2->base;
            sVar16 = ppVar2->off;
            (puVar9 + sVar16)[0] = '\0';
            (puVar9 + sVar16)[1] = '\0';
            ppVar2->off = ppVar2->off + 2;
            iVar5 = 0;
          }
          if (iVar5 == 0) {
            iVar5 = ptls_buffer_reserve(ppVar2,2);
            if (iVar5 == 0) {
              puVar9 = ppVar2->base;
              sVar16 = ppVar2->off;
              (puVar9 + sVar16)[0] = '\0';
              (puVar9 + sVar16)[1] = '\0';
              ppVar2->off = ppVar2->off + 2;
              iVar5 = 0;
            }
            cVar4 = '\x03';
            if (iVar5 == 0) {
              local_210 = ppVar2->off;
              sVar16 = build_certificate_verify_signdata(data,tls->key_schedule,context_string);
              psVar3 = tls->ctx->sign_certificate;
              pVar19.len = sVar16;
              pVar19.base = data;
              iVar5 = (*psVar3->cb)(psVar3,tls,&algo,ppVar2,pVar19,signature_algorithms->list,
                                    signature_algorithms->count);
              cVar4 = '\x03';
              if (iVar5 == 0) {
                local_220->secret[(long)(ppVar2->base + -0x10)] = algo._1_1_;
                local_220->secret[(long)(ppVar2->base + -0xf)] = (uint8_t)algo;
                sVar16 = ppVar2->off;
                lVar8 = 8;
                sVar11 = local_210;
                do {
                  ppVar2->base[sVar11 - 2] = (uint8_t)(sVar16 - local_210 >> ((byte)lVar8 & 0x3f));
                  lVar8 = lVar8 + -8;
                  sVar11 = sVar11 + 1;
                } while (lVar8 != -8);
                cVar4 = '\0';
              }
            }
          }
          else {
            cVar4 = (iVar5 != 0) * '\x03';
          }
          ppVar15 = local_218;
          if (cVar4 == '\0') {
            uVar7 = local_230->off - sVar12;
            lVar8 = 0x10;
            do {
              local_230->base[sVar12 - 3] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + -8;
              sVar12 = sVar12 + 1;
            } while (lVar8 != -8);
            bVar17 = true;
          }
          else {
            bVar17 = false;
          }
        }
        else {
          bVar17 = false;
        }
        if (bVar17) {
          bVar17 = true;
          if ((ppVar15 != (ptls_key_schedule_t *)0x0) && (ppVar15->num_hashes != 0)) {
            puVar9 = local_230->base + local_228;
            sVar16 = local_230->off - local_228;
            pppVar14 = &ppVar15->hashes[0].ctx;
            sVar12 = 0;
            do {
              (*(*pppVar14)->update)(*pppVar14,puVar9,sVar16);
              sVar12 = sVar12 + 1;
              pppVar14 = pppVar14 + 2;
            } while (sVar12 != ppVar15->num_hashes);
            bVar17 = true;
          }
          goto joined_r0x0011e201;
        }
      }
      bVar17 = false;
      goto joined_r0x0011e201;
    }
    if ((tls->field_0x160 & 0x20) == 0) {
      (tls->handshake_buf).base = "";
      (tls->handshake_buf).capacity = 0;
      (tls->handshake_buf).off = 0;
      (tls->handshake_buf).is_allocated = 0;
      sVar12 = build_certificate_verify_signdata(handshake_data,tls->key_schedule,context_string);
    }
    else {
      sVar12 = 0;
    }
    if ((tls->field_0x160 & 0x20) != 0) goto LAB_0011dd68;
    pVar18.len = sVar12;
    pVar18.base = handshake_data;
    pVar6 = (*tls->ctx->private_key_method->sign)
                      (tls->ctx->sign_certificate,tls,&algo_1,&tls->handshake_buf,pVar18,
                       signature_algorithms->list,signature_algorithms->count);
  }
  else {
LAB_0011dd68:
    pVar6 = (*tls->ctx->private_key_method->complete)
                      (tls->ctx->sign_certificate,tls,&algo_1,&tls->handshake_buf);
  }
  if (pVar6 == ptls_private_key_failure) {
    tls->field_0x160 = tls->field_0x160 & 0xdf;
    return 0x209;
  }
  if (pVar6 == ptls_private_key_retry) {
    tls->field_0x160 = tls->field_0x160 | 0x20;
    return 0x202;
  }
  if (pVar6 != ptls_private_key_success) {
    return 0;
  }
  tls->field_0x160 = tls->field_0x160 & 0xdf;
  iVar5 = (*emitter->begin_message)(emitter);
  if (iVar5 != 0) {
    return iVar5;
  }
  ppVar2 = emitter->buf;
  ppVar15 = tls->key_schedule;
  ppVar13 = (ptls_buffer_t *)ppVar2->off;
  iVar5 = ptls_buffer_reserve(ppVar2,1);
  if (iVar5 == 0) {
    ppVar2->base[ppVar2->off] = '\x0f';
    ppVar2->off = ppVar2->off + 1;
    iVar5 = 0;
  }
  if (iVar5 == 0) {
    iVar5 = ptls_buffer_reserve(ppVar2,3);
    if (iVar5 == 0) {
      puVar9 = ppVar2->base;
      sVar12 = ppVar2->off;
      puVar9[sVar12 + 2] = '\0';
      puVar9 = puVar9 + sVar12;
      puVar9[0] = '\0';
      puVar9[1] = '\0';
      ppVar2->off = ppVar2->off + 3;
      iVar5 = 0;
    }
    if (iVar5 == 0) {
      sVar12 = ppVar2->off;
      buf = emitter->buf;
      local_218 = (ptls_key_schedule_t *)buf->off;
      local_228 = (tls->handshake_buf).off;
      local_230 = ppVar13;
      iVar5 = ptls_buffer_reserve(buf,2);
      if (iVar5 == 0) {
        puVar9 = buf->base;
        sVar16 = buf->off;
        (puVar9 + sVar16)[0] = '\0';
        (puVar9 + sVar16)[1] = '\0';
        buf->off = buf->off + 2;
        iVar5 = 0;
      }
      bVar17 = iVar5 == 0;
      if (bVar17) {
        iVar5 = ptls_buffer_reserve(buf,2);
        if (iVar5 == 0) {
          puVar9 = buf->base;
          sVar16 = buf->off;
          (puVar9 + sVar16)[0] = '\0';
          (puVar9 + sVar16)[1] = '\0';
          buf->off = buf->off + 2;
          iVar5 = 0;
        }
        if (iVar5 == 0) {
          sVar16 = buf->off;
          local_220 = ppVar15;
          iVar5 = ptls_buffer_reserve(buf,local_228);
          if (iVar5 == 0) {
            ppVar13 = &tls->handshake_buf;
            memcpy(buf->base + buf->off,ppVar13->base,local_228);
            buf->off = buf->off + local_228;
            ptls_buffer__release_memory(ppVar13);
            (tls->handshake_buf).off = 0;
            *(undefined8 *)&(tls->handshake_buf).is_allocated = 0;
            ppVar13->base = (uint8_t *)0x0;
            (tls->handshake_buf).capacity = 0;
            local_218->secret[(long)(buf->base + -0x10)] = algo_1._1_1_;
            local_218->secret[(long)(buf->base + -0xf)] = (uint8_t)algo_1;
            uVar7 = buf->off - sVar16;
            lVar8 = 8;
            do {
              buf->base[sVar16 - 2] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + -8;
              sVar16 = sVar16 + 1;
            } while (lVar8 != -8);
            bVar17 = true;
            ppVar15 = local_220;
          }
          else {
            bVar17 = false;
            ppVar15 = local_220;
          }
        }
        else {
          bVar17 = false;
        }
      }
      ppVar13 = local_230;
      if (bVar17) {
        uVar7 = ppVar2->off - sVar12;
        lVar8 = 0x10;
        do {
          ppVar2->base[sVar12 - 3] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + -8;
          sVar12 = sVar12 + 1;
        } while (lVar8 != -8);
        bVar17 = true;
      }
      else {
        bVar17 = false;
      }
    }
    else {
      bVar17 = false;
    }
    if (bVar17) {
      bVar17 = true;
      if ((ppVar15 != (ptls_key_schedule_t *)0x0) && (ppVar15->num_hashes != 0)) {
        puVar9 = ppVar2->base;
        sVar12 = ppVar2->off;
        pppVar14 = &ppVar15->hashes[0].ctx;
        sVar16 = 0;
        do {
          (*(*pppVar14)->update)
                    (*pppVar14,(uint8_t *)((long)&ppVar13->base + (long)puVar9),
                     sVar12 - (long)ppVar13);
          sVar16 = sVar16 + 1;
          pppVar14 = pppVar14 + 2;
        } while (sVar16 != ppVar15->num_hashes);
        bVar17 = true;
      }
      goto joined_r0x0011e201;
    }
  }
  bVar17 = false;
joined_r0x0011e201:
  if (bVar17) {
    iVar5 = (*emitter->commit_message)(emitter);
  }
  return iVar5;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request)
{
    static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
    ptls_emit_certificate_t *emit_certificate =
        tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    int ret;

    msg("send_certificate_and_certificate_verify");
    if (tls->in_handshake)
        goto resume_handshake;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    /* send Certificate (or the equivalent) */
    if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request)) != 0)
        goto Exit;

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        if ((tls->ctx->private_key_method) && (tls->is_server))
        {
            uint8_t  handshake_data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t   handshake_len = 0;
            if (!tls->in_handshake)
            {
                ptls_buffer_init(&tls->handshake_buf, "", 0);
                handshake_len = build_certificate_verify_signdata(handshake_data, tls->key_schedule, context_string);
            }
            enum ptls_private_key_result_t res;
            uint16_t algo;
            if (!tls->in_handshake)
            {
                res = tls->ctx->private_key_method->sign(tls->ctx->sign_certificate,
                                                         tls, &algo, &tls->handshake_buf,
                                                         ptls_iovec_init(handshake_data, handshake_len),
                                                         signature_algorithms->list,
                                                         signature_algorithms->count);
            }
            else
resume_handshake:
                res = tls->ctx->private_key_method->complete(tls->ctx->sign_certificate,
                                                             tls, &algo, &tls->handshake_buf);
            switch (res)
            {
                case ptls_private_key_success:
                    msg("Completed private_key_method");
                    ret = 0;
                    tls->in_handshake = 0;

                    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY,
                    {
                        ptls_buffer_t *sendbuf = emitter->buf;
                        size_t algo_off = sendbuf->off;
                        size_t siglen = tls->handshake_buf.off;
                        msg("signature len: %ld", siglen);
                        ptls_buffer_push16(sendbuf, 0); /* filled in later */
                        ptls_buffer_push_block(sendbuf, 2,
                        {
                            if ((ret = ptls_buffer_reserve(sendbuf, siglen)) != 0)
                            {
                                msg("Error reserving data space in signature");
                                goto Exit;
                            }
                            memcpy(sendbuf->base + sendbuf->off, tls->handshake_buf.base, siglen);
                            sendbuf->off += siglen;
                            ptls_buffer_dispose(&tls->handshake_buf);
                            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                            sendbuf->base[algo_off + 1] = (uint8_t)algo;
                        });
                    });
                    break;
                case ptls_private_key_retry:
                    msg("Retry private_key_method");
                    ret = PTLS_ERROR_IN_PROGRESS;
                    tls->in_handshake = 1;
                    goto Exit;
                case ptls_private_key_failure:
                    msg("FAILED private_key_method");
                    ret = PTLS_ERROR_SIGN_FAILURE;
                    tls->in_handshake = 0;
                    goto Exit;
            }
        }
        else
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
                ptls_buffer_t *sendbuf = emitter->buf;
                size_t algo_off = sendbuf->off;
                ptls_buffer_push16(sendbuf, 0); /* filled in later */
                ptls_buffer_push_block(sendbuf, 2, {
                    uint16_t algo;
                    uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                    size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                    if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                              ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                              signature_algorithms->count)) != 0) {
                        goto Exit;
                    }
                    sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                    sendbuf->base[algo_off + 1] = (uint8_t)algo;
                });
            });
    }

Exit:
    return ret;
}